

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O3

RPCHelpMan * getrawmempool(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string m_key_name;
  string cond;
  string m_key_name_00;
  string cond_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string cond_01;
  string description;
  string m_key_name_04;
  string description_00;
  string m_key_name_05;
  string description_01;
  string description_02;
  string description_03;
  string m_key_name_06;
  string description_04;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_05;
  string description_06;
  string description_07;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  RPCExamples examples;
  string description_08;
  string description_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  RPCHelpMan *in_RDI;
  undefined8 uVar6;
  long lVar7;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  undefined8 in_stack_fffffffffffff1f8;
  undefined8 in_stack_fffffffffffff208;
  undefined8 in_stack_fffffffffffff210;
  undefined8 in_stack_fffffffffffff218;
  code *pcVar8;
  undefined8 in_stack_fffffffffffff220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff228;
  pointer in_stack_fffffffffffff238;
  pointer pRVar9;
  pointer in_stack_fffffffffffff240;
  pointer pRVar10;
  pointer in_stack_fffffffffffff248;
  pointer pRVar11;
  undefined8 in_stack_fffffffffffff250;
  pointer in_stack_fffffffffffff258;
  pointer pRVar12;
  pointer in_stack_fffffffffffff260;
  pointer pRVar13;
  pointer in_stack_fffffffffffff268;
  pointer pRVar14;
  undefined8 in_stack_fffffffffffff270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff288;
  RPCArgOptions in_stack_fffffffffffff298;
  allocator_type local_d19;
  vector<RPCResult,_std::allocator<RPCResult>_> local_d18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_cf8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ce0;
  allocator_type local_cc3;
  bool local_cc2;
  bool local_cc1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_cc0;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  ulong *local_be8;
  undefined8 local_be0;
  ulong local_bd8;
  undefined8 uStack_bd0;
  ulong *local_bc8;
  size_type local_bc0;
  ulong local_bb8;
  undefined8 uStack_bb0;
  long *local_ba8 [2];
  long local_b98 [2];
  long *local_b88 [2];
  long local_b78 [2];
  long *local_b68 [2];
  long local_b58 [2];
  long *local_b48 [2];
  long local_b38 [2];
  undefined1 local_b28 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab0;
  long *local_aa0 [2];
  long local_a90 [2];
  long *local_a80 [2];
  long local_a70 [2];
  RPCResult local_a60;
  RPCResult local_9d8;
  long *local_950 [2];
  long local_940 [2];
  long *local_930 [2];
  long local_920 [2];
  long *local_910 [2];
  long local_900 [2];
  long *local_8f0 [2];
  long local_8e0 [2];
  long *local_8d0 [2];
  long local_8c0 [2];
  RPCResult local_8b0;
  long *local_828 [2];
  long local_818 [2];
  long *local_808 [2];
  long local_7f8 [2];
  long *local_7e8 [2];
  long local_7d8 [2];
  long *local_7c8 [2];
  long local_7b8 [2];
  long *local_7a8 [2];
  long local_798 [2];
  RPCResult local_788;
  vector<RPCResult,_std::allocator<RPCResult>_> local_700;
  long *local_6e0 [2];
  long local_6d0 [2];
  long *local_6c0 [2];
  long local_6b0 [2];
  RPCResult local_6a0;
  RPCResult local_618;
  RPCResult local_590;
  undefined1 local_508;
  undefined1 *local_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined7 uStack_4ef;
  undefined1 local_4e0 [32];
  long *local_4c0 [2];
  long local_4b0 [2];
  UniValue local_4a0;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_448;
  undefined1 local_3f0;
  long *local_3e8 [2];
  long local_3d8 [2];
  undefined1 local_3c8;
  undefined1 *local_3c0;
  undefined8 local_3b8;
  undefined1 local_3b0;
  undefined7 uStack_3af;
  undefined1 local_3a0 [32];
  long *local_380 [2];
  long local_370;
  undefined1 auStack_368 [8];
  undefined1 local_360 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  vector<UniValue,_std::allocator<UniValue>_> local_320;
  undefined1 local_308 [40];
  long local_2e0 [6];
  __index_type local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  RPCArg local_288;
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getrawmempool","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nReturns all transaction ids in memory pool as a json array of string transaction ids.\n\nHint: use getmempoolentry to fetch a specific transaction from the mempool.\n"
             ,"");
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"verbose","");
  local_cc1 = false;
  UniValue::UniValue<bool,_bool,_true>((UniValue *)local_360,&local_cc1);
  local_308._8_8_ = local_308 + 0x18;
  local_308._0_4_ = local_360._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._8_8_ == &local_348) {
    local_308._32_8_ = local_348._8_8_;
  }
  else {
    local_308._8_8_ = local_360._8_8_;
  }
  local_308._16_8_ = local_360._16_8_;
  local_360._16_8_ = 0;
  local_348._M_local_buf[0] = '\0';
  local_2e0[0] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_2e0[1] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e0[2] = (long)local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0[3]._0_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_2e0[3]._4_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_2e0[4]._0_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_2e0[4]._4_4_ =
       local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_2e0[5] = (long)local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_320.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b0 = '\x02';
  local_380[0] = &local_370;
  local_360._8_8_ = &local_348;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,"True for a json object, false for array of transaction ids","");
  local_3c0 = &local_3b0;
  local_3c8 = 0;
  local_3b8 = 0;
  local_3b0 = 0;
  local_3a0._0_8_ = (pointer)0x0;
  local_3a0._8_2_ = 0;
  local_3a0._10_6_ = 0;
  local_3a0._16_2_ = 0;
  local_3a0._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  name.field_2._8_8_ = in_stack_fffffffffffff210;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff220;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff218;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff228;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff238;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff240;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff248;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff250;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff258;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff260;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff268;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff270;
  description_08.field_2 = in_stack_fffffffffffff288;
  description_08._0_16_ = in_stack_fffffffffffff278;
  RPCArg::RPCArg(&local_288,name,(Type)&local_2a8,fallback,description_08,in_stack_fffffffffffff298)
  ;
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"mempool_sequence","");
  local_cc2 = false;
  UniValue::UniValue<bool,_bool,_true>(&local_4a0,&local_cc2);
  paVar1 = &local_4a0.val.field_2;
  local_448._8_8_ = (long)&local_448 + 0x18;
  local_448._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_4a0.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0.val._M_dataplus._M_p == paVar1) {
    local_448._32_8_ = local_4a0.val.field_2._8_8_;
  }
  else {
    local_448._8_8_ = local_4a0.val._M_dataplus._M_p;
  }
  local_448._16_8_ = local_4a0.val._M_string_length;
  local_4a0.val._M_string_length = 0;
  local_4a0.val.field_2._M_local_buf[0] = '\0';
  local_448._40_8_ =
       local_4a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_448._48_8_ =
       local_4a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_448._56_8_ =
       local_4a0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448._64_4_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_448._68_4_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_448._72_4_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_448._76_4_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_448._80_8_ =
       local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0 = 2;
  local_4c0[0] = local_4b0;
  local_4a0.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,
             "If verbose=false, returns a json object with transaction list and mempool sequence number attached."
             ,"");
  local_500 = &local_4f0;
  local_508 = 0;
  local_4f8 = 0;
  local_4f0 = 0;
  local_4e0._0_8_ = (pointer)0x0;
  local_4e0._8_2_ = 0;
  local_4e0._10_6_ = 0;
  local_4e0._16_2_ = 0;
  local_4e0._18_8_ = 0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  name_00.field_2._8_8_ = in_stack_fffffffffffff210;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff220;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff218;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff228;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff238;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff240;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff248;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff250;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff258;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff260;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff268;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff270;
  description_09.field_2 = in_stack_fffffffffffff288;
  description_09._0_16_ = in_stack_fffffffffffff278;
  RPCArg::RPCArg(&local_180,name_00,(Type)local_3e8,fallback_00,description_09,
                 in_stack_fffffffffffff298);
  __l._M_len = 2;
  __l._M_array = &local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_cc0,__l,&local_cc3);
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"for verbose = false","");
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"");
  local_700.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_700.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"");
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"");
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"The transaction id","");
  local_d18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff210;
  description._M_string_length = in_stack_fffffffffffff220;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  description.field_2 = in_stack_fffffffffffff228;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff240;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff238;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff248;
  RPCResult::RPCResult(&local_788,STR_HEX,m_key_name,description,inner,SUB81(local_7a8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_788;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_cf8,__l_00,&local_d19);
  cond._M_string_length = (size_type)in_RDI;
  cond._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  cond.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  cond.field_2._8_8_ = in_stack_fffffffffffff210;
  m_key_name_04._M_string_length = in_stack_fffffffffffff220;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  m_key_name_04.field_2 = in_stack_fffffffffffff228;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff240;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff238;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff248;
  description_05.field_2._8_8_ = in_stack_fffffffffffff250;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff260;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff258;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff268;
  RPCResult::RPCResult(&local_6a0,cond,(Type)local_6c0,m_key_name_04,description_05,inner_04);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"for verbose = true","");
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"");
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"");
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"transactionid","");
  local_8f0[0] = local_8e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0);
  MempoolEntryDescription();
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff210;
  description_00._M_string_length = in_stack_fffffffffffff220;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  description_00.field_2 = in_stack_fffffffffffff228;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff240;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff238;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff248;
  RPCResult::RPCResult(&local_8b0,OBJ,m_key_name_00,description_00,inner_00,SUB81(local_8d0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_8b0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2c8,__l_01,
             (allocator_type *)&stack0xfffffffffffff2af);
  cond_00._M_string_length = (size_type)in_RDI;
  cond_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  cond_00.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  cond_00.field_2._8_8_ = in_stack_fffffffffffff210;
  m_key_name_05._M_string_length = in_stack_fffffffffffff220;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  m_key_name_05.field_2 = in_stack_fffffffffffff228;
  description_06._M_string_length = (size_type)in_stack_fffffffffffff240;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff238;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff248;
  description_06.field_2._8_8_ = in_stack_fffffffffffff250;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff260;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff258;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff268;
  RPCResult::RPCResult(&local_618,cond_00,(Type)local_7e8,m_key_name_05,description_06,inner_05);
  local_910[0] = local_900;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_910,"for verbose = false and mempool_sequence = true","");
  local_930[0] = local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_930,"");
  local_950[0] = local_940;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_950,"");
  local_a80[0] = local_a70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a80,"txids","");
  local_aa0[0] = local_a90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa0,"");
  local_b48[0] = local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"");
  local_b68[0] = local_b58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"The transaction id","");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff210;
  description_01._M_string_length = in_stack_fffffffffffff220;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  description_01.field_2 = in_stack_fffffffffffff228;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff240;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff238;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff248;
  RPCResult::RPCResult
            ((RPCResult *)local_b28,STR_HEX,m_key_name_01,description_01,inner_01,SUB81(local_b48,0)
            );
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_b28;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff278,__l_02,
             (allocator_type *)&stack0xfffffffffffff257);
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff210;
  description_02._M_string_length = in_stack_fffffffffffff220;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  description_02.field_2 = in_stack_fffffffffffff228;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff240;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff238;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff248;
  RPCResult::RPCResult(&local_a60,ARR,m_key_name_02,description_02,inner_02,SUB81(local_a80,0));
  local_b88[0] = local_b78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"mempool_sequence","");
  local_ba8[0] = local_b98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ba8,"The mempool sequence value.","");
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff210;
  description_03._M_string_length = in_stack_fffffffffffff220;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  description_03.field_2 = in_stack_fffffffffffff228;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_9d8,NUM,m_key_name_03,description_03,inner_03,SUB81(local_b88,0));
  __l_03._M_len = 2;
  __l_03._M_array = &local_a60;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff290,__l_03,
             (allocator_type *)&stack0xfffffffffffff237);
  cond_01._M_string_length = (size_type)in_RDI;
  cond_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1f8;
  cond_01.field_2._M_allocated_capacity = in_stack_fffffffffffff208;
  cond_01.field_2._8_8_ = in_stack_fffffffffffff210;
  m_key_name_06._M_string_length = in_stack_fffffffffffff220;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff218;
  m_key_name_06.field_2 = in_stack_fffffffffffff228;
  description_07._M_string_length = (size_type)pRVar10;
  description_07._M_dataplus._M_p = (pointer)pRVar9;
  description_07.field_2._M_allocated_capacity = (size_type)pRVar11;
  description_07.field_2._8_8_ = in_stack_fffffffffffff250;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar13;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar12;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar14;
  RPCResult::RPCResult(&local_590,cond_01,(Type)local_910,m_key_name_06,description_07,inner_06);
  __l_04._M_len = 3;
  __l_04._M_array = &local_6a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_ce0,__l_04,(allocator_type *)&local_c08);
  local_c28._M_dataplus._M_p = (pointer)&local_c28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c28,"getrawmempool","");
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c48,"true","");
  HelpExampleCli(&local_c08,&local_c28,&local_c48);
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"getrawmempool","");
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"true","");
  HelpExampleRpc(&local_c68,&local_c88,&local_ca8);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    uVar6 = local_c08.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_c68._M_string_length + local_c08._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
      uVar6 = local_c68.field_2._M_allocated_capacity;
    }
    if (local_c68._M_string_length + local_c08._M_string_length <= (ulong)uVar6) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_c68,0,0,local_c08._M_dataplus._M_p,local_c08._M_string_length);
      goto LAB_00300530;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_c08,local_c68._M_dataplus._M_p,local_c68._M_string_length);
LAB_00300530:
  local_be8 = &local_bd8;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_bd8 = paVar1->_M_allocated_capacity;
    uStack_bd0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_bd8 = paVar1->_M_allocated_capacity;
    local_be8 = puVar2;
  }
  local_bc0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_be8 == &local_bd8) {
    uStack_bb0 = uStack_bd0;
    local_bc8 = &local_bb8;
  }
  else {
    local_bc8 = local_be8;
  }
  local_bb8 = local_bd8;
  local_be0 = 0;
  local_bd8 = local_bd8 & 0xffffffffffffff00;
  pcVar8 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:411:9)>
           ::_M_manager;
  description_04._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:411:9)>
       ::_M_invoke;
  description_04._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp:411:9)>
                ::_M_manager;
  description_04.field_2 = in_stack_fffffffffffff228;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff250;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar13;
  examples.m_examples._M_string_length = in_stack_fffffffffffff270;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar14;
  examples.m_examples.field_2 = in_stack_fffffffffffff278;
  local_be8 = &local_bd8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff208)),description_04,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&stack0xfffffffffffff208,&stack0xfffffffffffff208,3);
  }
  if (local_bc8 != &local_bb8) {
    operator_delete(local_bc8,local_bb8 + 1);
  }
  if (local_be8 != &local_bd8) {
    operator_delete(local_be8,local_bd8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p,local_c68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p,local_ca8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p,local_c88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p,local_c08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
    operator_delete(local_c28._M_dataplus._M_p,local_c28.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ce0);
  lVar7 = 0x198;
  do {
    if ((long *)((long)local_6b0 + lVar7) != *(long **)((long)local_6c0 + lVar7)) {
      operator_delete(*(long **)((long)local_6c0 + lVar7),*(long *)((long)local_6b0 + lVar7) + 1);
    }
    if ((long *)((long)local_6d0 + lVar7) != *(long **)((long)local_6e0 + lVar7)) {
      operator_delete(*(long **)((long)local_6e0 + lVar7),*(long *)((long)local_6d0 + lVar7) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_700.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar7));
    plVar3 = *(long **)((long)&local_788.m_cond._M_dataplus._M_p + lVar7);
    plVar5 = (long *)(local_788.m_cond.field_2._M_local_buf + lVar7);
    if (plVar5 != plVar3) {
      operator_delete(plVar3,*plVar5 + 1);
    }
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff290);
  lVar7 = 0x110;
  do {
    if ((long *)((long)local_a70 + lVar7) != *(long **)((long)local_a80 + lVar7)) {
      operator_delete(*(long **)((long)local_a80 + lVar7),*(long *)((long)local_a70 + lVar7) + 1);
    }
    if ((long *)((long)local_a90 + lVar7) != *(long **)((long)local_aa0 + lVar7)) {
      operator_delete(*(long **)((long)local_aa0 + lVar7),*(long *)((long)local_a90 + lVar7) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_b28 + lVar7 + 0x68));
    if ((long *)(local_b28 + lVar7 + 0x58) != *(long **)(local_b28 + lVar7 + 0x48)) {
      operator_delete(*(long **)(local_b28 + lVar7 + 0x48),*(long *)(local_b28 + lVar7 + 0x58) + 1);
    }
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff238);
  if (local_ba8[0] != local_b98) {
    operator_delete(local_ba8[0],local_b98[0] + 1);
  }
  if (local_b88[0] != local_b78) {
    operator_delete(local_b88[0],local_b78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._104_8_ != &local_ab0) {
    operator_delete((void *)local_b28._104_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_b28._72_8_ != local_b28 + 0x58) {
    operator_delete((void *)local_b28._72_8_,local_b28._88_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)(local_b28 + 0x28));
  if ((undefined1 *)local_b28._8_8_ != local_b28 + 0x18) {
    operator_delete((void *)local_b28._8_8_,local_b28._24_8_ + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff258);
  if (local_b68[0] != local_b58) {
    operator_delete(local_b68[0],local_b58[0] + 1);
  }
  if (local_b48[0] != local_b38) {
    operator_delete(local_b48[0],local_b38[0] + 1);
  }
  if (local_aa0[0] != local_a90) {
    operator_delete(local_aa0[0],local_a90[0] + 1);
  }
  if (local_a80[0] != local_a70) {
    operator_delete(local_a80[0],local_a70[0] + 1);
  }
  if (local_950[0] != local_940) {
    operator_delete(local_950[0],local_940[0] + 1);
  }
  if (local_930[0] != local_920) {
    operator_delete(local_930[0],local_920[0] + 1);
  }
  if (local_910[0] != local_900) {
    operator_delete(local_910[0],local_900[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0.m_cond._M_dataplus._M_p != &local_8b0.m_cond.field_2) {
    operator_delete(local_8b0.m_cond._M_dataplus._M_p,
                    local_8b0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0.m_description._M_dataplus._M_p != &local_8b0.m_description.field_2) {
    operator_delete(local_8b0.m_description._M_dataplus._M_p,
                    local_8b0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_8b0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0.m_key_name._M_dataplus._M_p != &local_8b0.m_key_name.field_2) {
    operator_delete(local_8b0.m_key_name._M_dataplus._M_p,
                    local_8b0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff2b0);
  if (local_8f0[0] != local_8e0) {
    operator_delete(local_8f0[0],local_8e0[0] + 1);
  }
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0],local_8c0[0] + 1);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0],local_818[0] + 1);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0],local_7d8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_cf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_cond._M_dataplus._M_p != &local_788.m_cond.field_2) {
    operator_delete(local_788.m_cond._M_dataplus._M_p,
                    local_788.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_description._M_dataplus._M_p != &local_788.m_description.field_2) {
    operator_delete(local_788.m_description._M_dataplus._M_p,
                    local_788.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_788.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_key_name._M_dataplus._M_p != &local_788.m_key_name.field_2) {
    operator_delete(local_788.m_key_name._M_dataplus._M_p,
                    local_788.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d18);
  if (local_7c8[0] != local_7b8) {
    operator_delete(local_7c8[0],local_7b8[0] + 1);
  }
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0],local_798[0] + 1);
  }
  if (local_700.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_700.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_700.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_700.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  if (local_6e0[0] != local_6d0) {
    operator_delete(local_6e0[0],local_6d0[0] + 1);
  }
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_cc0);
  lVar7 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar7));
    if ((long *)(local_308 + lVar7 + 0x50) != *(long **)(local_308 + lVar7 + 0x40)) {
      operator_delete(*(long **)(local_308 + lVar7 + 0x40),*(long *)(local_308 + lVar7 + 0x50) + 1);
    }
    if ((long *)(local_308 + lVar7 + 0x28) != *(long **)(local_308 + lVar7 + 0x18)) {
      operator_delete(*(long **)(local_308 + lVar7 + 0x18),*(long *)(local_308 + lVar7 + 0x28) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_360 + lVar7 + 0x10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(auStack_368 + lVar7));
    if ((long *)((long)local_380 + lVar7) != *(long **)(local_3a0 + lVar7 + 0x10)) {
      operator_delete(*(long **)(local_3a0 + lVar7 + 0x10),*(long *)((long)local_380 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x108;
  } while (lVar7 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e0);
  if (local_500 != &local_4f0) {
    operator_delete(local_500,CONCAT71(uStack_4ef,local_4f0) + 1);
  }
  if (local_4c0[0] != local_4b0) {
    operator_delete(local_4c0[0],local_4b0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_448._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4a0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0.val._M_dataplus._M_p != &local_4a0.val.field_2) {
    operator_delete(local_4a0.val._M_dataplus._M_p,
                    CONCAT71(local_4a0.val.field_2._M_allocated_capacity._1_7_,
                             local_4a0.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3a0);
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
  }
  if (local_380[0] != &local_370) {
    operator_delete(local_380[0],local_370 + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)local_308);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._8_8_ != &local_348) {
    operator_delete((void *)local_360._8_8_,
                    CONCAT71(local_348._M_allocated_capacity._1_7_,local_348._M_local_buf[0]) + 1);
  }
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawmempool()
{
    return RPCHelpMan{"getrawmempool",
        "\nReturns all transaction ids in memory pool as a json array of string transaction ids.\n"
        "\nHint: use getmempoolentry to fetch a specific transaction from the mempool.\n",
        {
            {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false}, "True for a json object, false for array of transaction ids"},
            {"mempool_sequence", RPCArg::Type::BOOL, RPCArg::Default{false}, "If verbose=false, returns a json object with transaction list and mempool sequence number attached."},
        },
        {
            RPCResult{"for verbose = false",
                RPCResult::Type::ARR, "", "",
                {
                    {RPCResult::Type::STR_HEX, "", "The transaction id"},
                }},
            RPCResult{"for verbose = true",
                RPCResult::Type::OBJ_DYN, "", "",
                {
                    {RPCResult::Type::OBJ, "transactionid", "", MempoolEntryDescription()},
                }},
            RPCResult{"for verbose = false and mempool_sequence = true",
                RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::ARR, "txids", "",
                    {
                        {RPCResult::Type::STR_HEX, "", "The transaction id"},
                    }},
                    {RPCResult::Type::NUM, "mempool_sequence", "The mempool sequence value."},
                }},
        },
        RPCExamples{
            HelpExampleCli("getrawmempool", "true")
            + HelpExampleRpc("getrawmempool", "true")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    bool fVerbose = false;
    if (!request.params[0].isNull())
        fVerbose = request.params[0].get_bool();

    bool include_mempool_sequence = false;
    if (!request.params[1].isNull()) {
        include_mempool_sequence = request.params[1].get_bool();
    }

    return MempoolToJSON(EnsureAnyMemPool(request.context), fVerbose, include_mempool_sequence);
},
    };
}